

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

void __thiscall Symbol::print(Symbol *this)

{
  long lVar1;
  long *plVar2;
  pointer pSVar3;
  ostream *poVar4;
  pointer pdVar5;
  pointer piVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  
  poVar9 = (ostream *)&std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Name: ",6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name_)._M_dataplus._M_p,
                      (this->name_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  switch(this->type_) {
  case kFunction:
    poVar4 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Method Args: ",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    if (0 < (int)((ulong)((long)(this->value_).args.
                                super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->value_).args.
                               super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3) * -0xf0f0f0f) {
      poVar4 = (ostream *)&std::cout;
      lVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    Arg ",8);
        lVar1 = lVar8 + 1;
        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,anon_var_dwarf_b08a + 0xc,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"        Name: ",0xe);
        pSVar3 = (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                 super__Vector_impl_data._M_start;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pSVar3[lVar8].name_._M_dataplus._M_p,
                            pSVar3[lVar8].name_._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        switch((this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8].type_) {
        case kInt:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"        Int Value: ",0x13);
          poVar9 = (ostream *)
                   std::ostream::operator<<
                             (&std::cout,
                              (this->value_).args.
                              super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar8].value_.int_value);
          break;
        case kIntArray:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"        Int Array: ",0x13);
          pSVar3 = (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar8 = *(long *)&(pSVar3->value_).int_array.super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl;
          poVar9 = (ostream *)&std::cout;
          if (0 < (int)((ulong)((long)*(pointer *)((long)&(pSVar3->value_).int_array + 8) - lVar8)
                       >> 2)) {
            lVar11 = 0x36;
            lVar7 = 0;
            do {
              poVar9 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)(lVar8 + lVar7 * 4));
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              lVar7 = lVar7 + 1;
              pSVar3 = (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              lVar8 = *(long *)((long)pSVar3 + lVar11 * 4 + -8);
              lVar10 = lVar11 * 4;
              lVar11 = lVar11 + 0x22;
            } while (lVar7 < (int)((ulong)(*(long *)((long)&(pSVar3->name_)._M_dataplus + lVar10) -
                                          lVar8) >> 2));
            poVar9 = (ostream *)&std::cout;
          }
          break;
        case kReal:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"        Real Value: ",0x14);
          poVar9 = std::ostream::_M_insert<double>
                             ((this->value_).args.
                              super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar8].value_.real_value);
          break;
        case kRealArray:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"        Real Array: ",0x14);
          pSVar3 = (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = *(long *)&(pSVar3->value_).real_array.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl;
          poVar9 = (ostream *)&std::cout;
          if (lVar8 < (int)((ulong)((long)*(pointer *)((long)&(pSVar3->value_).real_array + 8) -
                                   lVar11) >> 3)) {
            lVar10 = 0xf8;
            lVar7 = 0;
            do {
              poVar9 = std::ostream::_M_insert<double>(*(double *)(lVar11 + lVar7));
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              pSVar3 = (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              lVar11 = *(long *)((long)pSVar3 + lVar10 + -8);
              plVar2 = (long *)((long)&(pSVar3->name_)._M_dataplus + lVar10);
              lVar7 = lVar7 + 8;
              lVar10 = lVar10 + 0x88;
            } while (lVar8 < (int)((ulong)(*plVar2 - lVar11) >> 3));
            poVar9 = (ostream *)&std::cout;
          }
          break;
        default:
          goto switchD_001312c4_default;
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"        Is Assigned: ",0x15);
        poVar9 = std::ostream::_M_insert<bool>(true);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
switchD_001312c4_default:
        lVar8 = lVar1;
      } while (lVar1 < (int)((ulong)((long)(this->value_).args.
                                           super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->value_).args.
                                          super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0xf0f0f0f);
    }
    goto LAB_00131683;
  case kInt:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Int Value: ",0xb);
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,(this->value_).int_value);
    break;
  case kIntArray:
    poVar9 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Int Array: ",0xb);
    piVar6 = (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->value_).int_array.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar6) >> 2)) {
      lVar8 = 0;
      poVar9 = (ostream *)&std::cout;
      do {
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,piVar6[lVar8]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        lVar8 = lVar8 + 1;
        piVar6 = (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (lVar8 < (int)((ulong)((long)(this->value_).int_array.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish - (long)piVar6) >> 2));
    }
    break;
  case kReal:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Real Value: ",0xc);
    poVar9 = std::ostream::_M_insert<double>((this->value_).real_value);
    break;
  case kRealArray:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Real Array: ",0xc);
    pdVar5 = (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->value_).real_array.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar5) >> 3)) {
      lVar8 = 0;
      poVar9 = (ostream *)&std::cout;
      do {
        poVar4 = std::ostream::_M_insert<double>(pdVar5[lVar8]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        lVar8 = lVar8 + 1;
        pdVar5 = (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while (lVar8 < (int)((ulong)((long)(this->value_).real_array.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5)
                            >> 3));
    }
    break;
  default:
    goto switchD_00131175_default;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Is Assigned: ",0xd);
  poVar4 = std::ostream::_M_insert<bool>(true);
LAB_00131683:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
switchD_00131175_default:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"===================================",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  return;
}

Assistant:

void Symbol::print() const {
    std::cout << "Name: " << name_ << std::endl;
    if (type_ == Symbol::Type::kInt) {
        std::cout << "Int Value: " << value_.int_value << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kIntArray) {
        std::cout << "Int Array: ";
        for (int i = 0; i < (int)value_.int_array.size(); i++) {
            std::cout << value_.int_array[i] << " ";
        }
        std::cout << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kReal) {
        std::cout << "Real Value: " << value_.real_value << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kRealArray) {
        std::cout << "Real Array: ";
        for (int i = 0; i < (int)value_.real_array.size(); i++) {
            std::cout << value_.real_array[i] << " ";
        }
        std::cout << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kFunction) {
        std::cout << "Method Args: " << std::endl;
        for (int i = 0; i < (int)value_.args.size(); i++) {
            std::cout << "    Arg " << i + 1 << ":" << std::endl;
            std::cout << "        Name: " << value_.args[i].name_ << std::endl;
            if (value_.args[i].type_ == Symbol::Type::kInt) {
                std::cout << "        Int Value: " << value_.args[i].value_.int_value << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            } else if (value_.args[i].type_ == Symbol::Type::kIntArray) {
                std::cout << "        Int Array: ";
                for (int j = 0; j < (int)value_.args[j].value_.int_array.size(); j++) {
                    std::cout << value_.args[j].value_.int_array[j] << " ";
                }
                std::cout << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            } else if (value_.args[i].type_ == Symbol::Type::kReal) {
                std::cout << "        Real Value: " << value_.args[i].value_.real_value << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            } else if (value_.args[i].type_ == Symbol::Type::kRealArray) {
                std::cout << "        Real Array: ";
                for (int j = 0; i < (int) value_.args[j].value_.real_array.size(); j++) {
                    std::cout << value_.args[j].value_.real_array[j] << " ";
                }
                std::cout << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            }
        }
        std::cout << std::endl;
    }
    std::cout << "===================================" << std::endl;
}